

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LoopConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopConstraintSyntax,slang::syntax::LoopConstraintSyntax_const&>
          (BumpAllocator *this,LoopConstraintSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ForeachLoopListSyntax *pFVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  LoopConstraintSyntax *pLVar10;
  
  pLVar10 = (LoopConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LoopConstraintSyntax *)this->endPtr < pLVar10 + 1) {
    pLVar10 = (LoopConstraintSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pLVar10 + 1);
  }
  (pLVar10->constraints).ptr = (args->constraints).ptr;
  SVar8 = (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->foreachKeyword).kind;
  uVar5 = (args->foreachKeyword).field_0x2;
  NVar6.raw = (args->foreachKeyword).numFlags.raw;
  uVar7 = (args->foreachKeyword).rawLen;
  pFVar3 = (args->loopList).ptr;
  (pLVar10->foreachKeyword).info = (args->foreachKeyword).info;
  (pLVar10->loopList).ptr = pFVar3;
  (pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pLVar10->foreachKeyword).kind = TVar4;
  (pLVar10->foreachKeyword).field_0x2 = uVar5;
  (pLVar10->foreachKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pLVar10->foreachKeyword).rawLen = uVar7;
  (pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  return pLVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }